

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O0

xmlEntityPtr
xmlCreateEntity(xmlDictPtr dict,xmlChar *name,int type,xmlChar *ExternalID,xmlChar *SystemID,
               xmlChar *content)

{
  uint uVar1;
  xmlChar *pxVar2;
  xmlDictStringsPtr_conflict pxVar3;
  _xmlDict *p_Var4;
  xmlEntityPtr ret;
  xmlChar *content_local;
  xmlChar *SystemID_local;
  xmlChar *ExternalID_local;
  int type_local;
  xmlChar *name_local;
  xmlDictPtr dict_local;
  
  dict_local = (xmlDictPtr)(*xmlMalloc)(0x88);
  if (dict_local == (xmlDictPtr)0x0) {
    xmlEntitiesErrMemory("xmlCreateEntity: malloc failed");
    dict_local = (xmlDictPtr)0x0;
  }
  else {
    memset(dict_local,0,0x88);
    *(undefined4 *)&dict_local->dict = 0x11;
    *(undefined4 *)&dict_local[2].field_0x4 = 0;
    *(int *)&dict_local[1].field_0x1c = type;
    if (dict == (xmlDictPtr)0x0) {
      pxVar2 = xmlStrdup(name);
      dict_local->size = (size_t)pxVar2;
      if (ExternalID != (xmlChar *)0x0) {
        pxVar3 = (xmlDictStringsPtr_conflict)xmlStrdup(ExternalID);
        dict_local[1].strings = pxVar3;
      }
      if (SystemID != (xmlChar *)0x0) {
        p_Var4 = (_xmlDict *)xmlStrdup(SystemID);
        dict_local[1].subdict = p_Var4;
      }
    }
    else {
      pxVar2 = xmlDictLookup(dict,name,-1);
      dict_local->size = (size_t)pxVar2;
      if (ExternalID != (xmlChar *)0x0) {
        pxVar3 = (xmlDictStringsPtr_conflict)xmlDictLookup(dict,ExternalID,-1);
        dict_local[1].strings = pxVar3;
      }
      if (SystemID != (xmlChar *)0x0) {
        p_Var4 = (_xmlDict *)xmlDictLookup(dict,SystemID,-1);
        dict_local[1].subdict = p_Var4;
      }
    }
    if (content == (xmlChar *)0x0) {
      dict_local[1].nbElems = 0;
      dict_local[1].size = 0;
    }
    else {
      uVar1 = xmlStrlen(content);
      dict_local[1].nbElems = uVar1;
      if ((dict == (xmlDictPtr)0x0) || (4 < (int)dict_local[1].nbElems)) {
        pxVar2 = xmlStrndup(content,dict_local[1].nbElems);
        dict_local[1].size = (size_t)pxVar2;
      }
      else {
        pxVar2 = xmlDictLookup(dict,content,dict_local[1].nbElems);
        dict_local[1].size = (size_t)pxVar2;
      }
    }
    dict_local[1].limit = 0;
    dict_local[1].dict = (_xmlDictEntry *)0x0;
    dict_local[2].ref_counter = 0;
  }
  return (xmlEntityPtr)dict_local;
}

Assistant:

static xmlEntityPtr
xmlCreateEntity(xmlDictPtr dict, const xmlChar *name, int type,
	        const xmlChar *ExternalID, const xmlChar *SystemID,
	        const xmlChar *content) {
    xmlEntityPtr ret;

    ret = (xmlEntityPtr) xmlMalloc(sizeof(xmlEntity));
    if (ret == NULL) {
        xmlEntitiesErrMemory("xmlCreateEntity: malloc failed");
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlEntity));
    ret->type = XML_ENTITY_DECL;
    ret->checked = 0;

    /*
     * fill the structure.
     */
    ret->etype = (xmlEntityType) type;
    if (dict == NULL) {
	ret->name = xmlStrdup(name);
	if (ExternalID != NULL)
	    ret->ExternalID = xmlStrdup(ExternalID);
	if (SystemID != NULL)
	    ret->SystemID = xmlStrdup(SystemID);
    } else {
        ret->name = xmlDictLookup(dict, name, -1);
	if (ExternalID != NULL)
	    ret->ExternalID = xmlDictLookup(dict, ExternalID, -1);
	if (SystemID != NULL)
	    ret->SystemID = xmlDictLookup(dict, SystemID, -1);
    }
    if (content != NULL) {
        ret->length = xmlStrlen(content);
	if ((dict != NULL) && (ret->length < 5))
	    ret->content = (xmlChar *)
	                   xmlDictLookup(dict, content, ret->length);
	else
	    ret->content = xmlStrndup(content, ret->length);
     } else {
        ret->length = 0;
        ret->content = NULL;
    }
    ret->URI = NULL; /* to be computed by the layer knowing
			the defining entity */
    ret->orig = NULL;
    ret->owner = 0;

    return(ret);
}